

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O3

cell * implementations::scheme::read_from
                 (cell *__return_storage_ptr__,
                 list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *tokens)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  int iVar3;
  string token;
  string local_a8;
  cell local_88;
  
  p_Var1 = (tokens->
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  p_Var2 = p_Var1[1]._M_next;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,p_Var2,(long)&(p_Var1[1]._M_prev)->_M_next + (long)p_Var2);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(tokens,(tokens->
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl._M_node.super__List_node_base._M_next);
  iVar3 = std::__cxx11::string::compare((char *)&local_a8);
  if (iVar3 == 0) {
    __return_storage_ptr__->type = List;
    (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2
    ;
    (__return_storage_ptr__->val)._M_string_length = 0;
    (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->list).
    super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->list).
    super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->list).
    super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->env).
    super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__return_storage_ptr__->env).
    super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    iVar3 = std::__cxx11::string::compare
                      ((char *)((tokens->
                                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl._M_node.super__List_node_base._M_next + 1));
    if (iVar3 != 0) {
      do {
        read_from(&local_88,tokens);
        std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
        emplace_back<implementations::scheme::cell>(&__return_storage_ptr__->list,&local_88);
        if (local_88.env.
            super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.env.
                     super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
        ~vector(&local_88.list);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.val._M_dataplus._M_p != &local_88.val.field_2) {
          operator_delete(local_88.val._M_dataplus._M_p,
                          local_88.val.field_2._M_allocated_capacity + 1);
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((tokens->
                                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl._M_node.super__List_node_base._M_next + 1));
      } while (iVar3 != 0);
    }
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(tokens,(tokens->
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl._M_node.super__List_node_base._M_next);
  }
  else {
    atom(__return_storage_ptr__,&local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cell read_from(std::list<std::string> & tokens)
{
	const std::string token(tokens.front());
	tokens.pop_front();
	if (token == "(") {
		cell c(List);
		while (tokens.front() != ")")
			c.list.push_back(read_from(tokens));
		tokens.pop_front();
		return c;
	} else
		return atom(token);
}